

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase277::run(TestCase277 *this)

{
  Reader copyFrom;
  ArrayPtr<const_unsigned_char> local_178;
  ArrayPtr<const_unsigned_char> local_168;
  Orphan<capnp::Data> orphan;
  Builder root;
  bool local_108;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  root._builder._0_16_ = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  copyFrom = _::data("foo");
  Orphanage::newOrphanCopy<capnp::Data::Reader>(&orphan,(Orphanage *)&root,copyFrom);
  local_178 = (ArrayPtr<const_unsigned_char>)_::data("foo");
  local_168 = (ArrayPtr<const_unsigned_char>)OrphanBuilder::asDataReader(&orphan.builder);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&root,
             (DebugExpression<capnp::Data::Reader> *)&local_178,(Reader *)&local_168);
  if ((local_108 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_178 = (ArrayPtr<const_unsigned_char>)_::data("foo");
    local_168 = (ArrayPtr<const_unsigned_char>)OrphanBuilder::asDataReader(&orphan.builder);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x119,ERROR,
               "\"failed: expected \" \"(data(\\\"foo\\\")) == (orphan.getReader())\", _kjCondition, data(\"foo\"), orphan.getReader()"
               ,(char (*) [55])"failed: expected (data(\"foo\")) == (orphan.getReader())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&root,
               (Reader *)&local_178,(Reader *)&local_168);
  }
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptDataField(&root,&orphan);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, OrphanageDataCopy) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphanCopy(data("foo"));
  EXPECT_EQ(data("foo"), orphan.getReader());

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
}